

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryBuilder::readDylink(WasmBinaryBuilder *this,size_t payloadLen)

{
  uint32_t uVar1;
  pointer pDVar2;
  allocator<char> local_69;
  string local_68;
  string_view local_48;
  ulong local_38;
  size_t i;
  size_t numNeededDynlibs;
  size_t sectionPos;
  size_t local_18;
  size_t payloadLen_local;
  WasmBinaryBuilder *this_local;
  
  local_18 = payloadLen;
  payloadLen_local = (size_t)this;
  std::make_unique<wasm::DylinkSection>();
  std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::operator=
            (&this->wasm->dylinkSection,
             (unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_> *)
             &sectionPos);
  std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::~unique_ptr
            ((unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_> *)
             &sectionPos);
  numNeededDynlibs = this->pos;
  pDVar2 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
           operator->(&this->wasm->dylinkSection);
  pDVar2->isLegacy = true;
  uVar1 = getU32LEB(this);
  pDVar2 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
           operator->(&this->wasm->dylinkSection);
  pDVar2->memorySize = uVar1;
  uVar1 = getU32LEB(this);
  pDVar2 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
           operator->(&this->wasm->dylinkSection);
  pDVar2->memoryAlignment = uVar1;
  uVar1 = getU32LEB(this);
  pDVar2 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
           operator->(&this->wasm->dylinkSection);
  pDVar2->tableSize = uVar1;
  uVar1 = getU32LEB(this);
  pDVar2 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
           operator->(&this->wasm->dylinkSection);
  pDVar2->tableAlignment = uVar1;
  uVar1 = getU32LEB(this);
  i = (size_t)uVar1;
  for (local_38 = 0; local_38 < i; local_38 = local_38 + 1) {
    pDVar2 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
             operator->(&this->wasm->dylinkSection);
    local_48 = (string_view)getInlineString(this);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              (&pDVar2->neededDynlibs,(value_type *)&local_48);
  }
  if (this->pos != numNeededDynlibs + local_18) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"bad dylink section size",&local_69);
    throwError(this,&local_68);
  }
  return;
}

Assistant:

void WasmBinaryBuilder::readDylink(size_t payloadLen) {
  wasm.dylinkSection = std::make_unique<DylinkSection>();

  auto sectionPos = pos;

  wasm.dylinkSection->isLegacy = true;
  wasm.dylinkSection->memorySize = getU32LEB();
  wasm.dylinkSection->memoryAlignment = getU32LEB();
  wasm.dylinkSection->tableSize = getU32LEB();
  wasm.dylinkSection->tableAlignment = getU32LEB();

  size_t numNeededDynlibs = getU32LEB();
  for (size_t i = 0; i < numNeededDynlibs; ++i) {
    wasm.dylinkSection->neededDynlibs.push_back(getInlineString());
  }

  if (pos != sectionPos + payloadLen) {
    throwError("bad dylink section size");
  }
}